

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_rpc_listener::stop(asio_rpc_listener *this)

{
  int iVar1;
  int in_ESI;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->listener_lock_);
  if (iVar1 == 0) {
    this->stopped_ = true;
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::close
              (&this->acceptor_,in_ESI);
    pthread_mutex_unlock((pthread_mutex_t *)&this->listener_lock_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

virtual void stop() override {
        auto_lock(listener_lock_);
        stopped_ = true;
        acceptor_.close();
    }